

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

string * __thiscall
tinyusdz::Stage::ExportToString_abi_cxx11_
          (string *__return_storage_ptr__,Stage *this,bool relative_path)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  string *psVar7;
  const_reference pvVar8;
  pointer ppVar9;
  uint32_t uVar10;
  string local_460;
  ulong local_440;
  size_t i_2;
  _Self local_418;
  _Self local_410;
  iterator it;
  token nameTok;
  size_t i_1;
  const_reference local_3d0;
  ulong local_3c8;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  string local_370 [32];
  string local_350;
  stringstream local_330 [8];
  stringstream meta_ss;
  ostream aoStack_320 [376];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [383];
  undefined1 local_19;
  Stage *pSStack_18;
  bool relative_path_local;
  Stage *this_local;
  
  psVar7 = __return_storage_ptr__;
  local_19 = relative_path;
  pSStack_18 = this;
  this_local = (Stage *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  uVar10 = (uint32_t)psVar7;
  ::std::operator<<(aoStack_198,"#usda 1.0\n");
  ::std::__cxx11::stringstream::stringstream(local_330);
  print_layer_metas_abi_cxx11_(&local_350,(tinyusdz *)&this->stage_metas,(LayerMetas *)0x1,uVar10);
  ::std::operator<<(aoStack_320,(string *)&local_350);
  ::std::__cxx11::string::~string((string *)&local_350);
  ::std::__cxx11::stringstream::str();
  lVar3 = ::std::__cxx11::string::size();
  ::std::__cxx11::string::~string(local_370);
  if (lVar3 != 0) {
    ::std::operator<<(aoStack_198,"(\n");
    ::std::__cxx11::stringstream::str();
    ::std::operator<<(aoStack_198,
                      (string *)&primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::__cxx11::string::~string
              ((string *)&primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::operator<<(aoStack_198,")\n");
  }
  ::std::operator<<(aoStack_198,"\n");
  sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                    (&(this->stage_metas).primChildren);
  sVar5 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size(&this->_root_nodes);
  if (sVar4 == sVar5) {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
           *)&i);
    for (local_3c8 = 0; uVar1 = local_3c8,
        sVar4 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                          (&this->_root_nodes), uVar1 < sVar4; local_3c8 = local_3c8 + 1) {
      pvVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (&this->_root_nodes,local_3c8);
      psVar7 = Prim::element_name_abi_cxx11_(pvVar6);
      local_3d0 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                            (&this->_root_nodes,local_3c8);
      ::std::
      map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
      ::emplace<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                ((map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                  *)&i,psVar7,&local_3d0);
    }
    for (nameTok.str_.field_2._8_8_ = 0;
        sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          (&(this->stage_metas).primChildren),
        (ulong)nameTok.str_.field_2._8_8_ < sVar4;
        nameTok.str_.field_2._8_8_ = nameTok.str_.field_2._8_8_ + 1) {
      pvVar8 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                         (&(this->stage_metas).primChildren,nameTok.str_.field_2._8_8_);
      uVar10 = (uint32_t)sVar4;
      Token::Token((Token *)&it,pvVar8);
      psVar7 = Token::str_abi_cxx11_((Token *)&it);
      local_410._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                   *)&i,psVar7);
      local_418._M_node =
           (_Base_ptr)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  *)&i);
      bVar2 = ::std::operator!=(&local_410,&local_418);
      if (bVar2) {
        ppVar9 = ::std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>
                 ::operator->(&local_410);
        tinyusdz::prim::print_prim_abi_cxx11_
                  ((string *)&i_2,(prim *)ppVar9->second,(Prim *)0x0,uVar10);
        ::std::operator<<(aoStack_198,(string *)&i_2);
        ::std::__cxx11::string::~string((string *)&i_2);
        sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          (&(this->stage_metas).primChildren);
        if (nameTok.str_.field_2._8_8_ != sVar4 - 1) {
          ::std::operator<<(aoStack_198,"\n");
        }
      }
      Token::~Token((Token *)&it);
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
            *)&i);
  }
  else {
    for (local_440 = 0; uVar1 = local_440,
        sVar4 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                          (&this->_root_nodes), uVar1 < sVar4; local_440 = local_440 + 1) {
      pvVar6 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                         (&this->_root_nodes,local_440);
      tinyusdz::prim::print_prim_abi_cxx11_(&local_460,(prim *)pvVar6,(Prim *)0x0,(uint32_t)sVar4);
      ::std::operator<<(aoStack_198,(string *)&local_460);
      ::std::__cxx11::string::~string((string *)&local_460);
      uVar1 = local_440;
      sVar4 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                        (&this->_root_nodes);
      if (uVar1 != sVar4 - 1) {
        ::std::operator<<(aoStack_198,"\n");
      }
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_330);
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Stage::ExportToString(bool relative_path) const {
  (void)relative_path; // TODO

  std::stringstream ss;

  ss << "#usda 1.0\n";

  std::stringstream meta_ss;
  meta_ss << print_layer_metas(stage_metas, /* indent */1);
  if (meta_ss.str().size()) {
    ss << "(\n";
    ss << meta_ss.str();
    ss << ")\n";
  }

  ss << "\n";

  if (stage_metas.primChildren.size() == _root_nodes.size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      primNameTable.emplace(_root_nodes[i].element_name(), &_root_nodes[i]);
    }

    for (size_t i = 0; i < stage_metas.primChildren.size(); i++) {
      value::token nameTok = stage_metas.primChildren[i];
      DCOUT(fmt::format("primChildren  {}/{} = {}", i,
                        stage_metas.primChildren.size(), nameTok.str()));
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        //PrimPrintRec(ss, *(it->second), 0);
        ss << prim::print_prim(*(it->second), 0);
        if (i != (stage_metas.primChildren.size() - 1)) {
          ss << "\n";
        }
      } else {
        // TODO: Report warning?
      }
    }
  } else {
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      //PrimPrintRec(ss, _root_nodes[i], 0);
      ss << prim::print_prim(_root_nodes[i], 0);

      if (i != (_root_nodes.size() - 1)) {
        ss << "\n";
      }
    }
  }

  return ss.str();
}